

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

unique_ptr<argo::json,_std::default_delete<argo::json>_> __thiscall
argo::parser::parse_value(parser *this,lexer *l,size_t nesting_depth)

{
  token_type tVar1;
  token *this_00;
  reader *prVar2;
  json_parser_exception *this_01;
  string *psVar3;
  size_t byte_index;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  this_00 = lexer::next((lexer *)nesting_depth);
  tVar1 = token::get_type(this_00);
  switch(tVar1) {
  case begin_array_e:
    parse_array(this,l,nesting_depth);
    return (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)
           (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)this;
  case begin_object_e:
    parse_object(this,l,nesting_depth);
    return (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)
           (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)this;
  default:
    this_01 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
    psVar3 = token::get_raw_value_abi_cxx11_(this_00);
    byte_index = reader::get_byte_index((reader *)l->_vptr_lexer);
    json_parser_exception::json_parser_exception(this_01,unexpected_token_e,psVar3,byte_index);
    __cxa_throw(this_01,&json_parser_exception::typeinfo,std::exception::~exception);
  case number_int_e:
    if (*(char *)&(l->m_token).m_raw_value._M_dataplus._M_p == '\x01') {
      parse_number_int(this,(token *)l);
      return (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)
             (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)this;
    }
    prVar2 = (reader *)operator_new(0x58);
    psVar3 = token::get_raw_value_abi_cxx11_(this_00);
    json::json((json *)prVar2,number_int_e,psVar3);
    break;
  case number_double_e:
    if (*(char *)&(l->m_token).m_raw_value._M_dataplus._M_p == '\x01') {
      parse_number_double(this,(token *)l);
      return (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)
             (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)this;
    }
    prVar2 = (reader *)operator_new(0x58);
    psVar3 = token::get_raw_value_abi_cxx11_(this_00);
    json::json((json *)prVar2,number_double_e,psVar3);
    break;
  case string_e:
    if (*(char *)((long)&(l->m_token).m_raw_value._M_dataplus._M_p + 2) == '\x01') {
      prVar2 = (reader *)operator_new(0x58);
      psVar3 = token::get_raw_value_abi_cxx11_(this_00);
      utf8::json_string_to_utf8((utf8 *)&local_30,psVar3);
      json::json((json *)prVar2,
                 (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_30);
      this->m_reader = prVar2;
      if (local_30._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
          (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        return (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)
               (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)this;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*(undefined8 **)
              local_30._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)local_30._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 0x10)) {
        operator_delete(*(undefined8 **)
                         local_30._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
      }
      operator_delete((void *)local_30._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl);
      return (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)
             (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)this;
    }
    prVar2 = (reader *)operator_new(0x58);
    psVar3 = token::get_raw_value_abi_cxx11_(this_00);
    json::json((json *)prVar2,string_e,psVar3);
    break;
  case false_e:
    prVar2 = (reader *)operator_new(0x58);
    json::json((json *)prVar2,false);
    break;
  case true_e:
    prVar2 = (reader *)operator_new(0x58);
    json::json((json *)prVar2,true);
    break;
  case null_e:
    prVar2 = (reader *)operator_new(0x58);
    json::json((json *)prVar2);
  }
  this->m_reader = prVar2;
  return (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)
         (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)this;
}

Assistant:

unique_ptr<json> parser::parse_value(lexer &l, size_t nesting_depth)
{
    const token &t = l.next();

    switch (t.get_type())
    {
    case token::begin_object_e:
        return parse_object(l, nesting_depth + 1);
    case token::begin_array_e:
        return parse_array(l, nesting_depth + 1);
    case token::number_int_e:
        if (m_convert_numbers)
        {
            return parse_number_int(t);
        }
        else
        {
            return unique_ptr<json>(new json(json::number_int_e, t.get_raw_value()));
        }
    case token::number_double_e:
        if (m_convert_numbers)
        {
            return parse_number_double(t);
        }
        else
        {
            return unique_ptr<json>(new json(json::number_double_e, t.get_raw_value()));
        }
    case token::string_e:
        if (m_convert_strings)
        {
            try
            {
                return unique_ptr<json>(new json(utf8::json_string_to_utf8(t.get_raw_value())));
            }
            catch (json_utf8_exception &e)
            {
                e.add_byte_index(m_reader.get_byte_index());
                throw e;
            }
        }
        else
        {
            return unique_ptr<json>(new json(json::string_e, t.get_raw_value()));
        }
    case token::false_e:
        return unique_ptr<json>(new json(false));
    case token::true_e:
        return unique_ptr<json>(new json(true));
    case token::null_e:
        return unique_ptr<json>(new json);
    default:
        throw json_parser_exception(
                            json_parser_exception::unexpected_token_e,
                            t.get_raw_value(),
                            m_reader.get_byte_index());
    }
}